

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O3

void ComputeConfigCRC(void)

{
  size_t i;
  long lVar1;
  ostream *poVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  uint bnum;
  long lVar6;
  
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  lVar4 = 0xe;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"    // Version: ",0x10);
    pcVar5 = "Firewire";
    if (lVar4 == 0xe) {
      pcVar5 = "Ethernet";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    always @(*)",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    begin",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"        case (board_id)",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    lVar6 = 0;
    do {
      lVar1 = 0;
      do {
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"            4\'h",0xf);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": info_crc = 16\'h",0x11);
      lVar1 = *(long *)poVar2;
      *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
      lVar1 = *(long *)(lVar1 + -0x18);
      poVar3 = poVar2 + lVar1;
      if (poVar2[lVar1 + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar3);
        poVar3[0xe1] = (ostream)0x1;
      }
      poVar3[0xe0] = (ostream)0x30;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        endcase",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    end",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  lVar4 = 0;
  do {
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x14);
  lVar4 = 0;
  do {
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    Root Directory CRC (Rev 1,2): ",0x22);
  lVar4 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 4;
  lVar4 = *(long *)(lVar4 + -0x18);
  if ((&DAT_0012e2c1)[lVar4] == '\0') {
    std::ios::widen((char)lVar4 + -0x20);
    (&DAT_0012e2c1)[lVar4] = 1;
  }
  setsockopt[lVar4] = (code)0x30;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar4 = 0;
  do {
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    Vendor Descriptor CRC: ",0x1b);
  lVar4 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 4;
  lVar4 = *(long *)(lVar4 + -0x18);
  if ((&DAT_0012e2c1)[lVar4] == '\0') {
    std::ios::widen((char)lVar4 + -0x20);
    (&DAT_0012e2c1)[lVar4] = 1;
  }
  setsockopt[lVar4] = (code)0x30;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar4 = 0;
  do {
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x14);
  lVar4 = 0;
  do {
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    Model Descriptor CRC (Rev 1,2): ",0x24);
  lVar4 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 4;
  lVar4 = *(long *)(lVar4 + -0x18);
  if ((&DAT_0012e2c1)[lVar4] == '\0') {
    std::ios::widen((char)lVar4 + -0x20);
    (&DAT_0012e2c1)[lVar4] = 1;
  }
  setsockopt[lVar4] = (code)0x30;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  return;
}

Assistant:

void ComputeConfigCRC()
{
    uint16_t crc16, crc16Eth;
    quadlet_t bus_info[4];
    bus_info[0] = bswap_32(0x31333934);  // "1394"
    bus_info[1] = bswap_32(0x00ffa000);
    bus_info[2] = bswap_32(0xfa610e00);  // LCSR CID + BID + E/F
    bus_info[3] = bswap_32(0x00000007);  // Firmware version
    std::cout << std::hex;
    for (unsigned int bver = 0x0e; bver <= 0x0f; bver++) {
        std::cout << "    // Version: " << ((bver == 0x0e) ? "Ethernet" : "Firewire") << std::endl;
        std::cout << "    always @(*)" << std::endl;
        std::cout << "    begin" << std::endl;
        std::cout << "        case (board_id)" << std::endl;
        for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++) {
            bus_info[2] = bswap_32(0xfa610e00|(bnum << 4)|bver);
            crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(bus_info), sizeof(bus_info));
            std::cout << "            4'h" << bnum << ": info_crc = 16'h"
                      << std::setw(4) << std::setfill('0') << crc16 << ";" << std::endl;
        }
        std::cout << "        endcase" << std::endl;
        std::cout << "    end" << std::endl;
    }
    quadlet_t root_dir[5];
    root_dir[0] = bswap_32(0x0c0083c0);
    root_dir[1] = bswap_32(0x03fa610e);
    root_dir[2] = bswap_32(0x81000003);
    root_dir[3] = bswap_32(0x17000001);
    root_dir[4] = bswap_32(0x81000006);
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(root_dir), sizeof(root_dir));
    root_dir[3] = bswap_32(0x17000002);
    crc16Eth = ComputeCRC16(reinterpret_cast<unsigned char *>(root_dir), sizeof(root_dir));
    std::cout << "    Root Directory CRC (Rev 1,2): " << std::setw(4) << std::setfill('0') << crc16
              << ", " << crc16Eth << std::endl;
    quadlet_t vendor_desc[4];
    vendor_desc[0] = bswap_32(0x00000000);
    vendor_desc[1] = bswap_32(0x00000000);
    vendor_desc[2] = bswap_32(0x4A485520);  // "JHU "
    vendor_desc[3] = bswap_32(0x4C435352);  // "LCSR"
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(vendor_desc), sizeof(vendor_desc));
    std::cout << "    Vendor Descriptor CRC: " << std::setw(4) << std::setfill('0') << crc16
              << std::endl;
    quadlet_t model_desc[5];
    model_desc[0] = bswap_32(0x00000000);
    model_desc[1] = bswap_32(0x00000000);
    model_desc[2] = bswap_32(0x46504741);   // "FPGA"
    model_desc[3] = bswap_32(0x312F514C);   // "1/QL"
    model_desc[4] = bswap_32(0x41000000);   // "A"
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(model_desc), sizeof(model_desc));
    model_desc[3] = bswap_32(0x322F514C);   // "2/QL"
    crc16Eth = ComputeCRC16(reinterpret_cast<unsigned char *>(model_desc), sizeof(model_desc));
    std::cout << "    Model Descriptor CRC (Rev 1,2): " << std::setw(4) << std::setfill('0') << crc16
              << ", " << crc16Eth << std::endl;
    std::cout << std::dec;
}